

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O2

bool __thiscall
cs::domain_type::add_var_optimal(domain_type *this,string *name,var *val,bool override)

{
  size_t sVar1;
  MappedReference<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char>,_unsigned_long>_>
  puVar2;
  
  sVar1 = phmap::priv::
          raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
          ::count<std::__cxx11::string>
                    ((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                      *)this,name);
  if (sVar1 != 0) {
    if (this->optimize == true) {
      puVar2 = phmap::priv::
               raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
               ::
               at<std::__cxx11::string,phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>>
                         ((raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                           *)this,name);
      cs_impl::any::operator=
                ((this->m_slot).super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>.
                 _M_impl.super__Vector_impl_data._M_start + *puVar2,val);
      return true;
    }
    if (!override) {
      return false;
    }
  }
  add_var(this,name,val);
  return true;
}

Assistant:

bool add_var_optimal(const std::string &name, const var &val, bool override = false)
		{
			if (m_reflect.count(name) > 0) {
				if (optimize) {
					m_slot[m_reflect.at(name)] = val;
					return true;
				}
				else if (override) {
					add_var(name, val);
					return true;
				}
				else
					return false;
			}
			else {
				add_var(name, val);
				return true;
			}
		}